

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataflow.cpp
# Opt level: O0

Variable * __thiscall nwcpp::Dataflow::DeclareVariable(Dataflow *this,string *name)

{
  byte bVar1;
  pointer pVVar2;
  string *psVar3;
  ostream *poVar4;
  runtime_error *this_00;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nwcpp::Variable_*>_>,_bool>
  pVar5;
  unique_ptr<nwcpp::Node,_std::default_delete<nwcpp::Node>_> local_240;
  undefined1 local_231;
  string local_230 [32];
  stringstream local_210 [8];
  stringstream msg;
  ostream local_200 [376];
  _Base_ptr local_88;
  byte local_80;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nwcpp::Variable_*>
  local_68;
  _Base_ptr local_40;
  byte local_38;
  pointer local_30;
  pointer ptr;
  __single_object var;
  Passkey passkey;
  string *name_local;
  Dataflow *this_local;
  
  Passkey::Passkey((Passkey *)&var,this);
  std::make_unique<nwcpp::Variable,nwcpp::Passkey&,std::__cxx11::string_const&>
            ((Passkey *)&ptr,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var);
  local_30 = std::unique_ptr<nwcpp::Variable,_std::default_delete<nwcpp::Variable>_>::get
                       ((unique_ptr<nwcpp::Variable,_std::default_delete<nwcpp::Variable>_> *)&ptr);
  pVVar2 = std::unique_ptr<nwcpp::Variable,_std::default_delete<nwcpp::Variable>_>::operator->
                     ((unique_ptr<nwcpp::Variable,_std::default_delete<nwcpp::Variable>_> *)&ptr);
  psVar3 = Variable::name_abi_cxx11_(pVVar2);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nwcpp::Variable_*>
  ::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nwcpp::Variable_*,_true>
            (&local_68,psVar3,&local_30);
  pVar5 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nwcpp::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nwcpp::Variable_*>_>_>
          ::insert(&this->variables_,&local_68);
  local_88 = (_Base_ptr)pVar5.first._M_node;
  local_80 = pVar5.second;
  bVar1 = local_80 ^ 0xff;
  local_40 = local_88;
  local_38 = local_80;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nwcpp::Variable_*>
  ::~pair(&local_68);
  if ((bVar1 & 1) == 0) {
    std::unique_ptr<nwcpp::Node,std::default_delete<nwcpp::Node>>::
    unique_ptr<nwcpp::Variable,std::default_delete<nwcpp::Variable>,void>
              ((unique_ptr<nwcpp::Node,std::default_delete<nwcpp::Node>> *)&local_240,
               (unique_ptr<nwcpp::Variable,_std::default_delete<nwcpp::Variable>_> *)&ptr);
    std::
    vector<std::unique_ptr<nwcpp::Node,_std::default_delete<nwcpp::Node>_>,_std::allocator<std::unique_ptr<nwcpp::Node,_std::default_delete<nwcpp::Node>_>_>_>
    ::push_back(&this->nodes_,(value_type *)&local_240);
    std::unique_ptr<nwcpp::Node,_std::default_delete<nwcpp::Node>_>::~unique_ptr(&local_240);
    pVVar2 = local_30;
    std::unique_ptr<nwcpp::Variable,_std::default_delete<nwcpp::Variable>_>::~unique_ptr
              ((unique_ptr<nwcpp::Variable,_std::default_delete<nwcpp::Variable>_> *)&ptr);
    return pVVar2;
  }
  std::__cxx11::stringstream::stringstream(local_210);
  poVar4 = std::operator<<(local_200,"Duplicate variable name (\'");
  pVVar2 = std::unique_ptr<nwcpp::Variable,_std::default_delete<nwcpp::Variable>_>::operator->
                     ((unique_ptr<nwcpp::Variable,_std::default_delete<nwcpp::Variable>_> *)&ptr);
  psVar3 = Variable::name_abi_cxx11_(pVVar2);
  poVar4 = std::operator<<(poVar4,(string *)psVar3);
  std::operator<<(poVar4,"\')");
  local_231 = 1;
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::str();
  std::runtime_error::runtime_error(this_00,local_230);
  local_231 = 0;
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Variable* Dataflow::DeclareVariable(const std::string& name) {
  Passkey passkey(this);
  auto var = std::make_unique<Variable>(passkey, name);
  const auto ptr = var.get();
  if (!variables_.insert({ var->name(), ptr }).second) {
    std::stringstream msg;
    msg << "Duplicate variable name ('" << var->name() << "')";
    throw std::runtime_error(msg.str());
  }
  nodes_.push_back(std::move(var));
  return ptr;
}